

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.cpp
# Opt level: O1

void __thiscall
FactoredDecPOMDPDiscrete::ClipRewardModel(FactoredDecPOMDPDiscrete *this,Index sf,bool sparse)

{
  long lVar1;
  ulong uVar2;
  RewardModelMappingSparse *this_00;
  size_t sVar3;
  ulong uVar4;
  size_t nrS;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  string local_70;
  string local_50;
  undefined8 extraout_XMM0_Qb;
  
  if (this->_m_cached_FlatRM == true) {
    if (this->_m_p_rModel != (RewardModel *)0x0) {
      (*(this->_m_p_rModel->super_RewardModelDiscreteInterface).super_QTableInterface.
        _vptr_QTableInterface[3])();
    }
    this->_m_cached_FlatRM = false;
  }
  this->_m_sparse_FlatRM = sparse;
  lVar1 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                 super_MultiAgentDecisionProcess + 0xa8))(this);
  if (lVar1 == 0) {
    nrS = 1;
  }
  else {
    nrS = 1;
    uVar5 = 0;
    do {
      if (sf != uVar5) {
        lVar1 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates)
                                       .super_MultiAgentDecisionProcess + 0xc0))
                          (this,uVar5 & 0xffffffff);
        nrS = nrS * lVar1;
      }
      uVar5 = uVar5 + 1;
      uVar2 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                     super_MultiAgentDecisionProcess + 0xa8))(this);
    } while (uVar5 < uVar2);
  }
  if (sparse) {
    this_00 = (RewardModelMappingSparse *)operator_new(200);
    sVar3 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                   super_MultiAgentDecisionProcess + 0x110))(this);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"s","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ja","");
    RewardModelMappingSparse::RewardModelMappingSparse(this_00,nrS,sVar3,&local_50,&local_70);
  }
  else {
    this_00 = (RewardModelMappingSparse *)operator_new(0x80);
    sVar3 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                   super_MultiAgentDecisionProcess + 0x110))(this);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"s","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ja","");
    RewardModelMapping::RewardModelMapping
              ((RewardModelMapping *)this_00,nrS,sVar3,&local_50,&local_70);
  }
  this->_m_p_rModel = &this_00->super_RewardModel;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (nrS != 0) {
    uVar5 = 0;
    do {
      lVar1 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                     super_MultiAgentDecisionProcess + 0x110))(this);
      if (lVar1 != 0) {
        uVar2 = 0;
        do {
          auVar7._0_8_ = (**(code **)(*(long *)&(this->
                                                super_MultiAgentDecisionProcessDiscreteFactoredStates
                                                ).super_MultiAgentDecisionProcess + 0x2d0))
                                   (this,uVar5,uVar2);
          auVar7._8_8_ = extraout_XMM0_Qb;
          auVar6._8_8_ = 0x7fffffffffffffff;
          auVar6._0_8_ = 0x7fffffffffffffff;
          auVar6 = vandpd_avx512vl(auVar7,auVar6);
          if (1e-12 <= auVar6._0_8_) {
            (*(this->_m_p_rModel->super_RewardModelDiscreteInterface).super_QTableInterface.
              _vptr_QTableInterface[1])(this->_m_p_rModel,uVar5,uVar2);
          }
          uVar2 = (ulong)((int)uVar2 + 1);
          uVar4 = (**(code **)(*(long *)&(this->
                                         super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                         super_MultiAgentDecisionProcess + 0x110))(this);
        } while (uVar2 < uVar4);
      }
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (uVar5 < nrS);
  }
  this->_m_cached_FlatRM = true;
  return;
}

Assistant:

void FactoredDecPOMDPDiscrete::ClipRewardModel(Index sf, bool sparse)
{
    if(_m_cached_FlatRM){
        delete(_m_p_rModel);
        _m_cached_FlatRM = false;
    }

    _m_sparse_FlatRM = sparse;

    size_t nrS = 1;
    for(size_t i = 0; i < GetNrStateFactors(); i++){
      if(i == sf)
        continue;
      size_t nrX = GetNrValuesForFactor(i);
      nrS *= nrX;
    }

    if(sparse)
        _m_p_rModel=new RewardModelMappingSparse(nrS,
                                                 GetNrJointActions());
    else
        _m_p_rModel=new RewardModelMapping(nrS,
                                           GetNrJointActions());

    for(Index sI=0; sI<nrS; sI++)
        for(Index jaI=0; jaI<GetNrJointActions(); jaI++)
        {
            double r = GetReward(sI, jaI);
        
            if( abs(r) >= REWARD_PRECISION )                
                _m_p_rModel->Set(sI, jaI, r);
        }

    _m_cached_FlatRM = true;
}